

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

bool __thiscall
node::anon_unknown_2::ChainImpl::findFirstBlockWithTimeAndHeight
          (ChainImpl *this,int64_t min_time,int min_height,FoundBlock *block)

{
  bool bVar1;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar2;
  Chainstate *pCVar3;
  CBlockIndex *index;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> lock;
  unique_lock<std::recursive_mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_device = &cs_main.super_recursive_mutex;
  local_40._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_40);
  puVar2 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&this->m_node->chainman,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                      ,0x35d,"chainman","m_node.chainman");
  pCVar3 = ChainstateManager::ActiveChainstate
                     ((puVar2->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  index = CChain::FindEarliestAtLeast(&pCVar3->m_chain,min_time,min_height);
  puVar2 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&this->m_node->chainman,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                      ,0x35d,"chainman","m_node.chainman");
  bVar1 = FillBlock(index,block,(UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_40,
                    &pCVar3->m_chain,
                    &((puVar2->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_blockman);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool findFirstBlockWithTimeAndHeight(int64_t min_time, int min_height, const FoundBlock& block) override
    {
        WAIT_LOCK(cs_main, lock);
        const CChain& active = chainman().ActiveChain();
        return FillBlock(active.FindEarliestAtLeast(min_time, min_height), block, lock, active, chainman().m_blockman);
    }